

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

int narrow_conv_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  IRIns *pIVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  uint *puVar6;
  jit_State *J;
  IRIns *pIVar7;
  NarrowIns *pNVar8;
  int iVar9;
  int iVar10;
  BPropEntry *pBVar11;
  uint uVar12;
  uint mode;
  IRRef1 *pIVar13;
  ulong uVar14;
  double dVar15;
  
  puVar6 = nc->sp;
  if (nc->maxsp <= puVar6) {
    return 10;
  }
  J = nc->J;
  pIVar7 = (J->cur).ir;
  uVar14 = (ulong)ref;
  cVar3 = *(char *)((long)pIVar7 + uVar14 * 8 + 5);
  if (cVar3 == '\x1c') {
    dVar2 = *(double *)&pIVar7[uVar14 + 1].i;
    if ((nc->mode & 0xf000) == 0) {
      dVar15 = (double)(long)dVar2;
      if (dVar2 != dVar15) {
        return 10;
      }
      if (NAN(dVar2) || NAN(dVar15)) {
        return 10;
      }
      *puVar6 = 0x30000;
      nc->sp = puVar6 + 2;
      puVar6[1] = (uint)(long)dVar2;
    }
    else {
      uVar12 = (uint)dVar2;
      if ((int)(short)uVar12 != uVar12) {
        return 10;
      }
      if (dVar2 != (double)(int)dVar2) {
        return 10;
      }
      if (NAN(dVar2) || NAN((double)(int)dVar2)) {
        return 10;
      }
      *puVar6 = 0x30000;
      nc->sp = puVar6 + 2;
      puVar6[1] = uVar12;
    }
  }
  else {
    if ((cVar3 == '[') && ((*(ushort *)((long)pIVar7 + uVar14 * 8 + 2) & 0x1f) == 0x13)) {
      uVar5 = pIVar7[uVar14].field_0.op1;
      if ((nc->mode & 0xf000) < 0x1001) {
        narrow_stripov_backprop(nc,(uint)uVar5,depth + 1);
      }
      else {
        nc->sp = puVar6 + 1;
        *puVar6 = (uint)uVar5;
      }
      if (nc->t == IRT_I64) {
        pNVar8 = nc->sp;
        nc->sp = pNVar8 + 1;
        *pNVar8 = 0x20000;
        return 0;
      }
      return 0;
    }
    bVar4 = (J->fold).ins.field_1.o;
    pIVar13 = J->chain + bVar4;
    while( true ) {
      uVar5 = *pIVar13;
      if (uVar5 <= ref) break;
      pIVar1 = pIVar7 + (uint)uVar5;
      if (((pIVar1->field_0).op1 == ref) &&
         ((bVar4 == 0x5c ||
          (((nc->mode & 0xfff) == ((pIVar1->field_0).op2 & 0xfff) &&
           (((J->fold).ins.field_1.t.irt & 0x80) <= ((pIVar1->field_1).t.irt & 0x80))))))) {
        nc->sp = puVar6 + 1;
        *puVar6 = (uint)uVar5;
        return 0;
      }
      pIVar13 = &(pIVar1->field_0).prev;
    }
    if (1 < (byte)(cVar3 - 0x29U)) {
LAB_0012770b:
      nc->sp = puVar6 + 1;
      *puVar6 = ref + 0x10000;
      return 1;
    }
    uVar12 = nc->mode;
    mode = uVar12 | 0x1000;
    if ((uVar12 & 0xf000) != 0x2000) {
      mode = uVar12;
    }
    if (depth < 1) {
      mode = uVar12;
    }
    pBVar11 = narrow_bpc_get(J,(IRRef1)ref,mode);
    if (pBVar11 == (BPropEntry *)0x0) {
      if ((nc->t != IRT_I64) ||
         (pBVar11 = narrow_bpc_get(J,(IRRef1)ref,0x226e), pBVar11 == (BPropEntry *)0x0)) {
        if (depth < 99) {
          iVar9 = narrow_conv_backprop(nc,(uint)pIVar7[uVar14].field_0.op1,depth + 1);
          iVar10 = narrow_conv_backprop
                             (nc,(uint)*(ushort *)((long)pIVar7 + uVar14 * 8 + 2),depth + 1);
          if (iVar10 + iVar9 < 2) {
            bVar4 = *(byte *)((long)pIVar7 + uVar14 * 8 + 5);
            pNVar8 = nc->sp;
            nc->sp = pNVar8 + 1;
            *pNVar8 = (nc->t << 0x10 | (uint)bVar4 << 0x18) + ref;
            return iVar10 + iVar9;
          }
        }
        goto LAB_0012770b;
      }
      *puVar6 = (uint)pBVar11->val;
      nc->sp = puVar6 + 2;
      puVar6[1] = 0x20000;
    }
    else {
      uVar5 = pBVar11->val;
      nc->sp = puVar6 + 1;
      *puVar6 = (uint)uVar5;
    }
  }
  return 0;
}

Assistant:

static int narrow_conv_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  IRRef cref;

  if (nc->sp >= nc->maxsp) return 10;  /* Path too deep. */

  /* Check the easy cases first. */
  if (ir->o == IR_CONV && (ir->op2 & IRCONV_SRCMASK) == IRT_INT) {
    if ((nc->mode & IRCONV_CONVMASK) <= IRCONV_ANY)
      narrow_stripov_backprop(nc, ir->op1, depth+1);
    else
      *nc->sp++ = NARROWINS(NARROW_REF, ir->op1);  /* Undo conversion. */
    if (nc->t == IRT_I64)
      *nc->sp++ = NARROWINS(NARROW_SEXT, 0);  /* Sign-extend integer. */
    return 0;
  } else if (ir->o == IR_KNUM) {  /* Narrow FP constant. */
    lua_Number n = ir_knum(ir)->n;
    if ((nc->mode & IRCONV_CONVMASK) == IRCONV_TOBIT) {
      /* Allows a wider range of constants. */
      int64_t k64 = (int64_t)n;
      if (n == (lua_Number)k64) {  /* Only if const doesn't lose precision. */
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k64;  /* But always truncate to 32 bits. */
	return 0;
      }
    } else {
      int32_t k = lj_num2int(n);
      /* Only if constant is a small integer. */
      if (checki16(k) && n == (lua_Number)k) {
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k;
	return 0;
      }
    }
    return 10;  /* Never narrow other FP constants (this is rare). */
  }

  /* Try to CSE the conversion. Stronger checks are ok, too. */
  cref = J->chain[fins->o];
  while (cref > ref) {
    IRIns *cr = IR(cref);
    if (cr->op1 == ref &&
	(fins->o == IR_TOBIT ||
	 ((cr->op2 & IRCONV_MODEMASK) == (nc->mode & IRCONV_MODEMASK) &&
	  irt_isguard(cr->t) >= irt_isguard(fins->t)))) {
      *nc->sp++ = NARROWINS(NARROW_REF, cref);
      return 0;  /* Already there, no additional conversion needed. */
    }
    cref = cr->prev;
  }

  /* Backpropagate across ADD/SUB. */
  if (ir->o == IR_ADD || ir->o == IR_SUB) {
    /* Try cache lookup first. */
    IRRef mode = nc->mode;
    BPropEntry *bp;
    /* Inner conversions need a stronger check. */
    if ((mode & IRCONV_CONVMASK) == IRCONV_INDEX && depth > 0)
      mode += IRCONV_CHECK-IRCONV_INDEX;
    bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
    if (bp) {
      *nc->sp++ = NARROWINS(NARROW_REF, bp->val);
      return 0;
    } else if (nc->t == IRT_I64) {
      /* Try sign-extending from an existing (checked) conversion to int. */
      mode = (IRT_INT<<5)|IRT_NUM|IRCONV_INDEX;
      bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
      if (bp) {
	*nc->sp++ = NARROWINS(NARROW_REF, bp->val);
	*nc->sp++ = NARROWINS(NARROW_SEXT, 0);
	return 0;
      }
    }
    if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      int count = narrow_conv_backprop(nc, ir->op1, depth);
      count += narrow_conv_backprop(nc, ir->op2, depth);
      if (count <= 1) {  /* Limit total number of conversions. */
	*nc->sp++ = NARROWINS(IRT(ir->o, nc->t), ref);
	return count;
      }
      nc->sp = savesp;  /* Too many conversions, need to backtrack. */
    }
  }

  /* Otherwise add a conversion. */
  *nc->sp++ = NARROWINS(NARROW_CONV, ref);
  return 1;
}